

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall
djb::microfacet::args::args(args *this,float_t ax,float_t ay,float_t cor,float_t txn,float_t tyn)

{
  ulong uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  
  fVar2 = 1.0 - cor * cor;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar5 = fVar2 * ay;
  (this->minv).r[0].x = ax;
  (this->minv).r[0].y = ay * cor;
  *(undefined8 *)&(this->minv).r[0].z = 0;
  (this->minv).r[1].y = fVar5;
  (this->minv).r[1].z = 0.0;
  uVar1 = CONCAT44(tyn,txn) ^ 0x8000000080000000;
  (this->minv).r[2].x = (float_t)(int)uVar1;
  (this->minv).r[2].y = (float_t)(int)(uVar1 >> 0x20);
  (this->minv).r[2].z = 1.0;
  (this->mtra).r[0].x = 1.0 / ax;
  (this->mtra).r[0].y = 0.0;
  auVar3._0_8_ = CONCAT44(cor,txn) ^ 0x8000000000000000;
  auVar3._12_4_ = ax * tyn - ay * txn * cor;
  auVar3._8_4_ = 0x3f800000;
  auVar4._4_4_ = fVar2 * ax;
  auVar4._0_4_ = ax;
  auVar4._8_4_ = fVar5;
  auVar4._12_4_ = fVar5 * ax;
  auVar4 = divps(auVar3,auVar4);
  *(undefined1 (*) [16])&(this->mtra).r[0].z = auVar4;
  (this->mtra).r[2].x = 0.0;
  (this->mtra).r[2].y = 0.0;
  (this->mtra).r[2].z = 1.0;
  this->detm = 1.0 / (fVar5 * ax);
  return;
}

Assistant:

microfacet::args::args(
	float_t ax, float_t ay, float_t cor, float_t txn, float_t tyn
) {
	float_t ccor = sqrt(1 - sqr(cor));
	float_t tmp = ay * ccor;
	float_t mtra21 = - cor / (ax * ccor);
	float_t mtra22 = 1 / tmp;
	float_t mtra23 = (ax * tyn - ay * txn * cor) / (ax * tmp);

	minv = mat3(
		ax   , ay * cor, 0,
		0    , tmp     , 0,
		-txn, -tyn     , 1
	);
	mtra = mat3(
		1 / ax, 0     , txn / ax,
		mtra21, mtra22, mtra23,
		0     , 0     ,   1
	);
	detm = 1 / (ax * tmp);
}